

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O2

void __thiscall TCLAP::SwitchArg::commonProcessing(SwitchArg *this)

{
  undefined1 *puVar1;
  Visitor *pVVar2;
  CmdLineParseException *pCVar3;
  allocator local_59;
  string local_58;
  string local_38;
  
  if ((this->super_Arg)._xorSet == true) {
    pCVar3 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
    std::__cxx11::string::string
              ((string *)&local_38,"Mutually exclusive argument already set!",&local_59);
    (*(this->super_Arg)._vptr_Arg[7])(&local_58,this);
    CmdLineParseException::CmdLineParseException(pCVar3,&local_38,&local_58);
    __cxa_throw(pCVar3,&CmdLineParseException::typeinfo,ArgException::~ArgException);
  }
  if ((this->super_Arg)._alreadySet != true) {
    (this->super_Arg)._alreadySet = true;
    puVar1 = &(this->super_Arg).field_0xa3;
    *puVar1 = *puVar1 ^ 1;
    pVVar2 = (this->super_Arg)._visitor;
    if (pVVar2 != (Visitor *)0x0) {
      (*pVVar2->_vptr_Visitor[2])();
      return;
    }
    return;
  }
  pCVar3 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
  std::__cxx11::string::string((string *)&local_38,"Argument already set!",&local_59);
  (*(this->super_Arg)._vptr_Arg[7])(&local_58,this);
  CmdLineParseException::CmdLineParseException(pCVar3,&local_38,&local_58);
  __cxa_throw(pCVar3,&CmdLineParseException::typeinfo,ArgException::~ArgException);
}

Assistant:

inline void SwitchArg::commonProcessing()
{
	if ( _xorSet )
		throw(CmdLineParseException(
		      "Mutually exclusive argument already set!", toString()));

	if ( _alreadySet ) 
		throw(CmdLineParseException("Argument already set!", toString()));

	_alreadySet = true;

	if ( _value == true )
		_value = false;
	else
		_value = true;

	_checkWithVisitor();
}